

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# volume.cpp
# Opt level: O0

bool __thiscall
VolumeFile::decryptData(VolumeFile *this,uint8_t *data,uint64_t dataSize,uint32_t seed)

{
  long in_RDX;
  uchar *in_RSI;
  long *in_RDI;
  Keyset *unaff_retaddr;
  Keyset *keyset;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  bool bVar1;
  
  if (in_RSI == (uchar *)0x0) {
    bVar1 = false;
  }
  else {
    if (in_RDX != 0) {
      (**(code **)(*in_RDI + 0x10))();
      Keyset::cryptBytes<unsigned_char*,unsigned_char*,void>
                (unaff_retaddr,
                 (uchar *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                 (uchar *)in_RDI,in_RSI,(uint32_t)((ulong)in_RDX >> 0x20));
    }
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool VolumeFile::decryptData(uint8_t* data, uint64_t dataSize, uint32_t seed) const
{
	if (!data) {
		return false;
	}

	if (dataSize > 0) {
		const auto& keyset = getKeyset();
		keyset.cryptBytes(data, data + dataSize, data, seed);
	}

	return true;
}